

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

void Gia_ManTerAnalyze2(Vec_Ptr_t *vStates,int nRegs)

{
  uint *puVar1;
  void *__s;
  byte bVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  if (0 < vStates->nSize) {
    uVar3 = vStates->nSize - 1;
    vStates->nSize = uVar3;
    __s = vStates->pArray[uVar3];
    uVar3 = ((nRegs >> 4) + 1) - (uint)((nRegs & 0xfU) == 0);
    memset(__s,0,(long)(int)uVar3 * 4);
    uVar7 = (ulong)uVar3;
    iVar6 = 0;
    if ((int)uVar3 < 1) {
      uVar7 = 0;
      iVar6 = 0;
    }
    for (; iVar6 < vStates->nSize; iVar6 = iVar6 + 1) {
      pvVar4 = Vec_PtrEntry(vStates,iVar6);
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        puVar1 = (uint *)((long)__s + uVar5 * 4);
        *puVar1 = *puVar1 | *(uint *)((long)pvVar4 + uVar5 * 4);
      }
    }
    if (nRegs < 1) {
      nRegs = 0;
    }
    for (iVar6 = 0; nRegs != iVar6; iVar6 = iVar6 + 1) {
    }
    printf("Found %d constant registers.\n");
    memset(__s,0,(long)(int)uVar3 * 4);
    for (iVar6 = 0; iVar6 < vStates->nSize; iVar6 = iVar6 + 1) {
      pvVar4 = Vec_PtrEntry(vStates,iVar6);
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        uVar3 = *(uint *)((long)pvVar4 + uVar5 * 4);
        puVar1 = (uint *)((long)__s + uVar5 * 4);
        *puVar1 = *puVar1 | ~(uVar3 >> 1 ^ uVar3) & 0x55555555;
      }
    }
    bVar2 = 0;
    uVar5 = 0;
    for (uVar7 = 0; nRegs != (int)uVar7; uVar7 = (ulong)((int)uVar7 + 1)) {
      uVar5 = (ulong)((int)uVar5 +
                     (uint)((*(uint *)((long)__s + (uVar7 >> 4) * 4) >> (bVar2 & 0x1e) & 3) == 0));
      bVar2 = bVar2 + 2;
    }
    printf("Found %d non-ternary registers.\n",uVar5);
    Vec_PtrPush(vStates,__s);
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

void Gia_ManTerAnalyze2( Vec_Ptr_t * vStates, int nRegs )
{
    unsigned * pTemp, * pStates = (unsigned *)Vec_PtrPop( vStates );
    int i, w, nZeros, nConsts, nStateWords;
    // detect constant zero registers
    nStateWords = Abc_BitWordNum( 2*nRegs );
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= pTemp[w];
    // count the number of zeros
    nZeros = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == GIA_ZER )
            nZeros++;
    printf( "Found %d constant registers.\n", nZeros );
    // detect non-ternary registers
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= (~(pTemp[w] ^ (pTemp[w] >> 1)) & 0x55555555);
    // count the nonternary registers
    nConsts = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == 0 )
            nConsts++;
    printf( "Found %d non-ternary registers.\n", nConsts );
    // return the state back
    Vec_PtrPush( vStates, pStates );
}